

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_sgemm_pack8to1_int8.h
# Opt level: O3

void ncnn::im2col_sgemm_pack8to1_int8_sse(Mat *bottom_im2col,Mat *top_blob,Mat *kernel,Option *opt)

{
  undefined1 auVar1 [16];
  uint uVar2;
  size_t sVar3;
  size_t sVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  int *piVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  undefined1 (*pauVar12) [16];
  ulong uVar13;
  uint uVar14;
  void *pvVar15;
  void *pvVar16;
  undefined4 *puVar17;
  int iVar18;
  long lVar19;
  ulong uVar20;
  undefined8 *puVar21;
  undefined1 (*pauVar22) [32];
  int nn;
  ulong uVar23;
  undefined1 (*pauVar24) [16];
  undefined8 *puVar25;
  undefined1 (*pauVar26) [32];
  undefined4 *puVar27;
  int iVar28;
  int iVar29;
  uint uVar30;
  long lVar31;
  undefined4 *puVar32;
  ulong uVar33;
  undefined4 *puVar34;
  long lVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [32];
  undefined1 auVar39 [64];
  undefined1 auVar40 [32];
  undefined1 auVar41 [64];
  undefined1 auVar42 [16];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [64];
  undefined1 auVar46 [32];
  undefined1 auVar47 [64];
  undefined1 auVar48 [16];
  undefined1 auVar49 [32];
  undefined1 auVar50 [64];
  undefined1 auVar51 [32];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 auVar54 [32];
  undefined1 auVar55 [64];
  undefined1 local_b8 [64];
  size_t local_78;
  Mat *local_70;
  Mat *local_68;
  ulong local_60;
  ulong local_58;
  long local_50;
  long local_48;
  void *local_40;
  ulong local_38;
  
  uVar2 = bottom_im2col->w;
  uVar33 = (ulong)(int)uVar2;
  iVar18 = bottom_im2col->h;
  uVar11 = bottom_im2col->c;
  uVar13 = (ulong)uVar11;
  local_60 = (ulong)top_blob->c;
  local_78 = 0;
  local_b8._0_8_ = (void *)0x0;
  local_b8._8_4_ = 0;
  local_b8._12_4_ = 0;
  local_b8._16_8_ = 0;
  local_b8._24_4_ = 0;
  local_b8._32_8_ = (Allocator *)0x0;
  local_b8._40_4_ = 0;
  local_b8._44_4_ = 0;
  local_b8._48_12_ = SUB1612((undefined1  [16])0x0,4);
  if ((long)uVar33 < 4) {
    uVar9 = uVar2;
    iVar28 = iVar18;
    if (1 < (int)uVar2) {
      iVar28 = iVar18 * 2;
      uVar9 = (uVar2 & 1) + 1;
    }
  }
  else {
    uVar9 = (uVar2 & 1) + (uVar2 >> 2) + (uint)((uVar2 >> 1 & 1) != 0);
    iVar28 = iVar18 * 4;
  }
  local_70 = top_blob;
  local_68 = kernel;
  Mat::create((Mat *)local_b8,iVar28,uVar11,uVar9,8,8,(Allocator *)opt);
  uVar9 = (int)uVar2 >> 2;
  if (0 < (int)uVar9) {
    lVar19 = 0;
    uVar20 = 0;
    do {
      if (0 < (int)uVar11) {
        pauVar22 = (undefined1 (*) [32])(local_78 * uVar20 * local_b8._16_8_ + local_b8._0_8_);
        uVar23 = 0;
        do {
          if (0 < iVar18) {
            pauVar26 = (undefined1 (*) [32])
                       ((long)bottom_im2col->data +
                       bottom_im2col->cstep * bottom_im2col->elemsize * uVar23 + lVar19);
            iVar28 = iVar18;
            do {
              *pauVar22 = *pauVar26;
              pauVar22 = pauVar22 + 1;
              pauVar26 = (undefined1 (*) [32])(*pauVar26 + (ulong)uVar2 * 8);
              iVar28 = iVar28 + -1;
            } while (iVar28 != 0);
          }
          uVar23 = uVar23 + 1;
        } while (uVar23 != uVar13);
      }
      uVar20 = uVar20 + 1;
      lVar19 = lVar19 + 0x20;
    } while (uVar20 != uVar9);
  }
  uVar14 = uVar2 >> 1 & 1;
  if ((uVar14 != 0) && (0 < (int)uVar11)) {
    pauVar12 = (undefined1 (*) [16])((long)(int)uVar9 * local_78 * local_b8._16_8_ + local_b8._0_8_)
    ;
    uVar20 = 0;
    do {
      if (0 < iVar18) {
        pauVar24 = (undefined1 (*) [16])
                   ((long)bottom_im2col->data +
                   bottom_im2col->cstep * bottom_im2col->elemsize * uVar20 +
                   (uVar33 & 0xfffffffffffffffc) * 8);
        iVar28 = iVar18;
        do {
          *pauVar12 = *pauVar24;
          pauVar12 = pauVar12 + 1;
          pauVar24 = (undefined1 (*) [16])(*pauVar24 + uVar33 * 8);
          iVar28 = iVar28 + -1;
        } while (iVar28 != 0);
      }
      uVar20 = uVar20 + 1;
    } while (uVar20 != uVar13);
  }
  iVar28 = (int)(uVar33 & 0xfffffffffffffffc) + uVar14 * 2;
  if (iVar28 < (int)uVar2) {
    uVar20 = (ulong)iVar28;
    pvVar15 = (void *)(uVar20 * 8 + (long)bottom_im2col->data);
    do {
      if (0 < (int)uVar11) {
        iVar10 = (int)uVar20;
        iVar28 = iVar10 + 3;
        if (-1 < iVar10) {
          iVar28 = iVar10;
        }
        puVar21 = (undefined8 *)
                  ((long)(int)((int)((char)((char)uVar20 - ((byte)iVar28 & 0xfc)) / '\x02') +
                              (iVar28 >> 2) +
                              (iVar10 - (((uint)(uVar20 >> 0x1f) & 1) + iVar10 & 0xfffffffe))) *
                   local_78 * local_b8._16_8_ + local_b8._0_8_);
        uVar23 = 0;
        do {
          if (0 < iVar18) {
            puVar25 = (undefined8 *)
                      (bottom_im2col->cstep * bottom_im2col->elemsize * uVar23 + (long)pvVar15);
            iVar28 = iVar18;
            do {
              *puVar21 = *puVar25;
              puVar21 = puVar21 + 1;
              puVar25 = puVar25 + uVar33;
              iVar28 = iVar28 + -1;
            } while (iVar28 != 0);
          }
          uVar23 = uVar23 + 1;
        } while (uVar23 != uVar13);
      }
      uVar20 = uVar20 + 1;
      pvVar15 = (void *)((long)pvVar15 + 8);
    } while ((long)uVar20 < (long)uVar33);
  }
  uVar9 = (int)local_60 >> 2;
  if (0 < (int)uVar9) {
    local_40 = local_70->data;
    local_48 = local_70->cstep * local_70->elemsize;
    pvVar15 = local_68->data;
    local_50 = local_68->cstep * local_68->elemsize;
    iVar28 = uVar11 * iVar18;
    local_58 = (ulong)uVar9;
    lVar19 = local_78 * local_b8._16_8_;
    uVar13 = 0;
    do {
      local_38 = uVar13;
      puVar32 = (undefined4 *)(local_38 * 4 * local_48 + (long)local_40);
      puVar34 = (undefined4 *)((local_38 * 4 + 1) * local_48 + (long)local_40);
      puVar17 = (undefined4 *)((local_38 * 4 + 2) * local_48 + (long)local_40);
      puVar27 = (undefined4 *)((local_38 * 4 + 3) * local_48 + (long)local_40);
      if ((int)uVar2 < 4) {
        uVar13 = 0;
      }
      else {
        uVar20 = 0;
        pvVar16 = (void *)local_b8._0_8_;
        do {
          if (iVar28 < 1) {
            auVar38 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
            auVar40 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
            auVar43 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
            auVar46 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
            auVar51 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
            auVar44 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
            auVar54 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
            auVar49 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
          }
          else {
            auVar50 = ZEXT1664((undefined1  [16])0x0);
            lVar31 = 0;
            auVar55 = ZEXT1664((undefined1  [16])0x0);
            auVar53 = ZEXT1664((undefined1  [16])0x0);
            auVar52 = ZEXT1664((undefined1  [16])0x0);
            auVar47 = ZEXT1664((undefined1  [16])0x0);
            auVar45 = ZEXT1664((undefined1  [16])0x0);
            auVar41 = ZEXT1664((undefined1  [16])0x0);
            auVar39 = ZEXT1664((undefined1  [16])0x0);
            iVar10 = iVar28;
            do {
              auVar44 = vpmovsxbw_avx2(*(undefined1 (*) [16])((long)pvVar16 + lVar31));
              auVar43 = vpmovsxbw_avx2(*(undefined1 (*) [16])((long)pvVar15 + lVar31));
              auVar38 = vpmovsxbw_avx2(*(undefined1 (*) [16])((long)pvVar15 + lVar31 + 0x10));
              auVar49 = vpmaddwd_avx2(auVar44,auVar43);
              auVar49 = vpaddd_avx2(auVar49,auVar50._0_32_);
              auVar50 = ZEXT3264(auVar49);
              auVar51 = vpermq_avx2(auVar44,0x4e);
              auVar54 = vpmaddwd_avx2(auVar51,auVar43);
              auVar54 = vpaddd_avx2(auVar54,auVar55._0_32_);
              auVar55 = ZEXT3264(auVar54);
              auVar44 = vpmaddwd_avx2(auVar44,auVar38);
              auVar44 = vpaddd_avx2(auVar44,auVar53._0_32_);
              auVar53 = ZEXT3264(auVar44);
              auVar51 = vpmaddwd_avx2(auVar51,auVar38);
              auVar40 = vpmovsxbw_avx2(*(undefined1 (*) [16])((long)pvVar16 + lVar31 + 0x10));
              auVar51 = vpaddd_avx2(auVar51,auVar52._0_32_);
              auVar52 = ZEXT3264(auVar51);
              auVar46 = vpmaddwd_avx2(auVar40,auVar43);
              auVar46 = vpaddd_avx2(auVar46,auVar47._0_32_);
              auVar47 = ZEXT3264(auVar46);
              auVar7 = vpermq_avx2(auVar40,0x4e);
              auVar43 = vpmaddwd_avx2(auVar7,auVar43);
              auVar43 = vpaddd_avx2(auVar43,auVar45._0_32_);
              auVar45 = ZEXT3264(auVar43);
              auVar40 = vpmaddwd_avx2(auVar40,auVar38);
              auVar40 = vpaddd_avx2(auVar40,auVar41._0_32_);
              auVar41 = ZEXT3264(auVar40);
              auVar38 = vpmaddwd_avx2(auVar7,auVar38);
              auVar38 = vpaddd_avx2(auVar38,auVar39._0_32_);
              auVar39 = ZEXT3264(auVar38);
              lVar31 = lVar31 + 0x20;
              iVar10 = iVar10 + -1;
            } while (iVar10 != 0);
          }
          auVar7 = vpunpckldq_avx2(auVar49,auVar54);
          auVar6 = vpunpckldq_avx2(auVar44,auVar51);
          auVar54 = vpunpckhdq_avx2(auVar49,auVar54);
          auVar44 = vpunpckhdq_avx2(auVar44,auVar51);
          auVar51 = vpunpcklqdq_avx2(auVar7,auVar6);
          auVar49 = vpunpckhqdq_avx2(auVar7,auVar6);
          auVar49 = vpaddd_avx2(auVar51,auVar49);
          auVar51 = vpunpcklqdq_avx2(auVar54,auVar44);
          auVar54 = vpunpckhqdq_avx2(auVar54,auVar44);
          auVar54 = vpaddd_avx2(auVar54,auVar51);
          auVar49 = vpaddd_avx2(auVar49,auVar54);
          auVar54 = vpunpckldq_avx2(auVar46,auVar43);
          auVar7 = vpunpckldq_avx2(auVar40,auVar38);
          auVar44 = vpunpckhdq_avx2(auVar46,auVar43);
          auVar51 = vpunpckhdq_avx2(auVar40,auVar38);
          auVar46 = vpunpcklqdq_avx2(auVar54,auVar7);
          auVar54 = vpunpckhqdq_avx2(auVar54,auVar7);
          auVar54 = vpaddd_avx2(auVar46,auVar54);
          auVar46 = vpunpcklqdq_avx2(auVar44,auVar51);
          *puVar32 = auVar49._0_4_;
          *puVar34 = auVar49._20_4_;
          auVar44 = vpunpckhqdq_avx2(auVar44,auVar51);
          *puVar17 = auVar49._8_4_;
          auVar44 = vpaddd_avx2(auVar44,auVar46);
          *puVar27 = auVar49._28_4_;
          auVar54 = vpaddd_avx2(auVar54,auVar44);
          puVar32[1] = auVar49._4_4_;
          puVar34[1] = auVar49._16_4_;
          puVar17[1] = auVar49._12_4_;
          puVar27[1] = auVar49._24_4_;
          puVar32[2] = auVar54._0_4_;
          puVar34[2] = auVar54._20_4_;
          puVar17[2] = auVar54._8_4_;
          puVar27[2] = auVar54._28_4_;
          puVar32[3] = auVar54._4_4_;
          puVar34[3] = auVar54._16_4_;
          puVar17[3] = auVar54._12_4_;
          puVar27[3] = auVar54._24_4_;
          puVar32 = puVar32 + 4;
          puVar34 = puVar34 + 4;
          puVar17 = puVar17 + 4;
          puVar27 = puVar27 + 4;
          uVar13 = uVar20 + 4;
          lVar31 = uVar20 + 7;
          pvVar16 = (void *)((long)pvVar16 + lVar19);
          uVar20 = uVar13;
        } while (lVar31 < (long)uVar33);
      }
      if ((int)((uint)uVar13 | 1) < (int)uVar2) {
        uVar9 = 0;
        do {
          iVar10 = (int)uVar13;
          if (iVar28 < 1) {
            auVar51 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
            auVar44 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
            auVar54 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
            auVar49 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
          }
          else {
            auVar39 = ZEXT1664((undefined1  [16])0x0);
            lVar31 = 0;
            auVar47 = ZEXT1664((undefined1  [16])0x0);
            auVar45 = ZEXT1664((undefined1  [16])0x0);
            auVar41 = ZEXT1664((undefined1  [16])0x0);
            iVar29 = iVar28;
            do {
              auVar44 = vpmovsxbw_avx2(*(undefined1 (*) [16])
                                        (local_b8._0_8_ +
                                        lVar31 + (ulong)((uVar9 & 1) +
                                                        ((uint)(uVar13 >> 2) & 0x3fffffff)) * lVar19
                                        ));
              auVar54 = vpmovsxbw_avx2(*(undefined1 (*) [16])((long)pvVar15 + lVar31 * 2));
              auVar51 = vpmovsxbw_avx2(*(undefined1 (*) [16])((long)pvVar15 + lVar31 * 2 + 0x10));
              auVar49 = vpmaddwd_avx2(auVar44,auVar54);
              auVar49 = vpaddd_avx2(auVar49,auVar39._0_32_);
              auVar39 = ZEXT3264(auVar49);
              auVar46 = vpermq_avx2(auVar44,0x4e);
              auVar54 = vpmaddwd_avx2(auVar46,auVar54);
              auVar54 = vpaddd_avx2(auVar54,auVar47._0_32_);
              auVar47 = ZEXT3264(auVar54);
              auVar44 = vpmaddwd_avx2(auVar44,auVar51);
              auVar44 = vpaddd_avx2(auVar44,auVar45._0_32_);
              auVar45 = ZEXT3264(auVar44);
              auVar51 = vpmaddwd_avx2(auVar46,auVar51);
              auVar51 = vpaddd_avx2(auVar51,auVar41._0_32_);
              auVar41 = ZEXT3264(auVar51);
              lVar31 = lVar31 + 0x10;
              iVar29 = iVar29 + -1;
            } while (iVar29 != 0);
          }
          auVar46 = vpunpckldq_avx2(auVar49,auVar54);
          auVar43 = vpunpckldq_avx2(auVar44,auVar51);
          auVar54 = vpunpckhdq_avx2(auVar49,auVar54);
          auVar44 = vpunpckhdq_avx2(auVar44,auVar51);
          auVar51 = vpunpcklqdq_avx2(auVar46,auVar43);
          auVar49 = vpunpckhqdq_avx2(auVar46,auVar43);
          auVar49 = vpaddd_avx2(auVar51,auVar49);
          auVar51 = vpunpcklqdq_avx2(auVar54,auVar44);
          auVar54 = vpunpckhqdq_avx2(auVar54,auVar44);
          auVar54 = vpaddd_avx2(auVar54,auVar51);
          auVar49 = vpaddd_avx2(auVar49,auVar54);
          *puVar32 = auVar49._0_4_;
          *puVar34 = auVar49._20_4_;
          *puVar17 = auVar49._8_4_;
          *puVar27 = auVar49._28_4_;
          puVar32[1] = auVar49._4_4_;
          puVar34[1] = auVar49._16_4_;
          puVar17[1] = auVar49._12_4_;
          puVar27[1] = auVar49._24_4_;
          puVar32 = puVar32 + 2;
          puVar34 = puVar34 + 2;
          puVar17 = puVar17 + 2;
          puVar27 = puVar27 + 2;
          uVar13 = (ulong)(iVar10 + 2);
          uVar9 = (uint)(byte)((char)uVar9 + 1);
        } while (iVar10 + 3 < (int)uVar2);
      }
      else {
        uVar13 = uVar13 & 0xffffffff;
      }
      if ((int)uVar13 < (int)uVar2) {
        do {
          uVar9 = (uint)uVar13;
          if (iVar28 < 1) {
            auVar49 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
            auVar54 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
          }
          else {
            auVar39 = ZEXT1664((undefined1  [16])0x0);
            lVar31 = 0;
            auVar41 = ZEXT1664((undefined1  [16])0x0);
            iVar10 = iVar28;
            do {
              auVar37._8_8_ = 0;
              auVar37._0_8_ =
                   *(ulong *)(local_b8._0_8_ +
                             lVar31 + (ulong)((uVar9 & 1) + (int)(uVar13 >> 2) +
                                             (uint)((uVar9 >> 1 & 1) != 0)) * lVar19);
              auVar37 = vpmovsxbw_avx(auVar37);
              auVar49 = vpmovsxbw_avx2(*(undefined1 (*) [16])((long)pvVar15 + lVar31 * 4));
              auVar54 = vpmovsxbw_avx2(*(undefined1 (*) [16])((long)pvVar15 + lVar31 * 4 + 0x10));
              auVar44._0_16_ = ZEXT116(0) * auVar37 + ZEXT116(1) * auVar37;
              auVar44._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar37
              ;
              auVar49 = vpmaddwd_avx2(auVar44,auVar49);
              auVar49 = vpaddd_avx2(auVar49,auVar41._0_32_);
              auVar41 = ZEXT3264(auVar49);
              auVar54 = vpmaddwd_avx2(auVar44,auVar54);
              auVar54 = vpaddd_avx2(auVar54,auVar39._0_32_);
              auVar39 = ZEXT3264(auVar54);
              lVar31 = lVar31 + 8;
              iVar10 = iVar10 + -1;
            } while (iVar10 != 0);
          }
          auVar37 = vpunpckldq_avx(auVar49._0_16_,auVar49._16_16_);
          auVar42 = vpunpckldq_avx(auVar54._0_16_,auVar54._16_16_);
          auVar48 = vpunpckhdq_avx(auVar49._0_16_,auVar49._16_16_);
          auVar36 = vpunpckhdq_avx(auVar54._0_16_,auVar54._16_16_);
          auVar5 = vpunpcklqdq_avx(auVar37,auVar42);
          auVar37 = vpunpckhqdq_avx(auVar37,auVar42);
          auVar37 = vpaddd_avx(auVar5,auVar37);
          auVar42 = vpunpcklqdq_avx(auVar48,auVar36);
          auVar48 = vpunpckhqdq_avx(auVar48,auVar36);
          auVar48 = vpaddd_avx(auVar48,auVar42);
          auVar37 = vpaddd_avx(auVar37,auVar48);
          *puVar32 = auVar37._0_4_;
          *puVar34 = auVar37._4_4_;
          *puVar17 = auVar37._8_4_;
          *puVar27 = auVar37._12_4_;
          puVar32 = puVar32 + 1;
          puVar34 = puVar34 + 1;
          puVar17 = puVar17 + 1;
          puVar27 = puVar27 + 1;
          uVar13 = (ulong)(uVar9 + 1);
        } while (uVar9 + 1 != uVar2);
      }
      pvVar15 = (void *)((long)pvVar15 + local_50);
      uVar13 = local_38 + 1;
    } while (local_38 + 1 != local_58);
  }
  uVar13 = local_60 & 0xfffffffffffffffc;
  if ((int)uVar13 != (int)local_60) {
    pvVar15 = local_70->data;
    sVar3 = local_70->cstep;
    sVar4 = local_70->elemsize;
    lVar19 = local_78 * local_b8._16_8_;
    pvVar16 = local_68->data;
    lVar31 = local_68->cstep * local_68->elemsize;
    iVar18 = iVar18 * uVar11;
    do {
      pauVar12 = (undefined1 (*) [16])(sVar3 * sVar4 * uVar13 + (long)pvVar15);
      uVar11 = (uint)uVar13;
      if ((int)uVar2 < 4) {
        uVar20 = 0;
      }
      else {
        uVar9 = uVar11 + 3;
        if (-1 < (int)uVar11) {
          uVar9 = uVar11;
        }
        uVar23 = 0;
        do {
          if (iVar18 < 1) {
            auVar49 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
            auVar54 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
          }
          else {
            pauVar24 = (undefined1 (*) [16])((uVar23 >> 2) * lVar19 + local_b8._0_8_);
            auVar39 = ZEXT1664((undefined1  [16])0x0);
            lVar35 = 0;
            auVar41 = ZEXT1664((undefined1  [16])0x0);
            do {
              auVar49 = vpmovsxbw_avx2(*pauVar24);
              auVar54 = vpmovsxbw_avx2(pauVar24[1]);
              auVar48._8_8_ = 0;
              auVar48._0_8_ =
                   *(ulong *)((long)pvVar16 +
                             lVar35 * 8 +
                             (int)(((int)uVar9 >> 2) + (uVar11 - (uVar9 & 0xfffffffc))) * lVar31);
              auVar44 = vpmovsxbw_avx2(auVar48);
              auVar44 = vpermq_avx2(auVar44,0x44);
              auVar49 = vpmaddwd_avx2(auVar49,auVar44);
              auVar49 = vpaddd_avx2(auVar49,auVar41._0_32_);
              auVar41 = ZEXT3264(auVar49);
              auVar54 = vpmaddwd_avx2(auVar54,auVar44);
              auVar54 = vpaddd_avx2(auVar54,auVar39._0_32_);
              auVar39 = ZEXT3264(auVar54);
              lVar35 = lVar35 + 1;
              pauVar24 = pauVar24 + 2;
            } while (iVar18 != (int)lVar35);
          }
          auVar37 = vpshufd_avx(auVar49._0_16_,0xee);
          auVar37 = vpaddd_avx(auVar37,auVar49._0_16_);
          auVar48 = vpshufd_avx(auVar49._16_16_,0xee);
          auVar48 = vpaddd_avx(auVar48,auVar49._16_16_);
          auVar48 = vphaddd_avx(auVar37,auVar48);
          auVar37 = vpshufd_avx(auVar54._0_16_,0xee);
          auVar37 = vpaddd_avx(auVar37,auVar54._0_16_);
          auVar36 = vphaddd_avx(auVar37,auVar37);
          auVar37 = vpshufd_avx(auVar54._16_16_,0xee);
          auVar37 = vpaddd_avx(auVar37,auVar54._16_16_);
          auVar37 = vphaddd_avx(auVar37,auVar37);
          auVar48 = vpshufd_avx(auVar48,0xe8);
          auVar48 = vpunpcklqdq_avx(auVar48,auVar36);
          auVar36._0_4_ = auVar37._0_4_;
          auVar36._4_4_ = auVar36._0_4_;
          auVar36._8_4_ = auVar36._0_4_;
          auVar36._12_4_ = auVar36._0_4_;
          auVar37 = vpblendd_avx2(auVar48,auVar36,8);
          *pauVar12 = auVar37;
          pauVar12 = pauVar12 + 1;
          uVar20 = uVar23 + 4;
          lVar35 = uVar23 + 7;
          uVar23 = uVar20;
        } while (lVar35 < (long)uVar33);
      }
      uVar9 = (uint)uVar20;
      if ((int)(uVar9 | 1) < (int)uVar2) {
        uVar14 = uVar11 + 3;
        if (-1 < (int)uVar11) {
          uVar14 = uVar11;
        }
        do {
          uVar30 = (uint)uVar20;
          if (iVar18 < 1) {
            auVar49 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
          }
          else {
            pauVar24 = (undefined1 (*) [16])
                       ((ulong)(((uint)(uVar20 >> 2) & 0x3fffffff) + (uint)((uVar30 >> 1 & 1) != 0))
                        * lVar19 + local_b8._0_8_);
            auVar39 = ZEXT1664((undefined1  [16])0x0);
            lVar35 = 0;
            do {
              auVar49 = vpmovsxbw_avx2(*pauVar24);
              auVar42._8_8_ = 0;
              auVar42._0_8_ =
                   *(ulong *)((long)pvVar16 +
                             lVar35 * 8 +
                             (int)(((int)uVar14 >> 2) + (uVar11 - (uVar14 & 0xfffffffc))) * lVar31);
              auVar54 = vpmovsxbw_avx2(auVar42);
              auVar54 = vpermq_avx2(auVar54,0x44);
              auVar49 = vpmaddwd_avx2(auVar49,auVar54);
              auVar49 = vpaddd_avx2(auVar49,auVar39._0_32_);
              auVar39 = ZEXT3264(auVar49);
              pauVar24 = pauVar24 + 1;
              lVar35 = lVar35 + 1;
            } while (iVar18 != (int)lVar35);
          }
          auVar37 = vpshufd_avx(auVar49._0_16_,0xee);
          auVar37 = vpaddd_avx(auVar37,auVar49._0_16_);
          auVar48 = vpshufd_avx(auVar49._16_16_,0xee);
          auVar48 = vpaddd_avx(auVar48,auVar49._16_16_);
          auVar37 = vphaddd_avx(auVar37,auVar48);
          auVar37 = vpshufd_avx(auVar37,0xe8);
          *(long *)*pauVar12 = auVar37._0_8_;
          pauVar12 = (undefined1 (*) [16])(*pauVar12 + 8);
          uVar9 = uVar30 + 2;
          uVar20 = (ulong)uVar9;
        } while ((int)(uVar30 + 3) < (int)uVar2);
      }
      if ((int)uVar9 < (int)uVar2) {
        uVar14 = uVar11 + 3;
        if (-1 < (int)uVar11) {
          uVar14 = uVar11;
        }
        do {
          if (iVar18 < 1) {
            auVar37 = (undefined1  [16])0x0;
          }
          else {
            auVar39 = ZEXT1664((undefined1  [16])0x0);
            lVar35 = 0;
            do {
              auVar5._8_8_ = 0;
              auVar5._0_8_ = *(ulong *)(local_b8._0_8_ +
                                       lVar35 * 8 +
                                       (ulong)((uVar9 & 1) + (uVar9 >> 2) +
                                              (uint)((uVar9 >> 1 & 1) != 0)) * lVar19);
              auVar37 = vpmovsxbw_avx(auVar5);
              auVar1._8_8_ = 0;
              auVar1._0_8_ = *(ulong *)((long)pvVar16 +
                                       lVar35 * 8 +
                                       (int)(((int)uVar14 >> 2) + (uVar11 - (uVar14 & 0xfffffffc)))
                                       * lVar31);
              auVar48 = vpmovsxbw_avx(auVar1);
              auVar37 = vpmaddwd_avx(auVar37,auVar48);
              auVar37 = vpaddd_avx(auVar37,auVar39._0_16_);
              auVar39 = ZEXT1664(auVar37);
              lVar35 = lVar35 + 1;
            } while (iVar18 != (int)lVar35);
          }
          auVar37 = vphaddd_avx(auVar37,auVar37);
          auVar37 = vphaddd_avx(auVar37,auVar37);
          *(int *)*pauVar12 = auVar37._0_4_;
          pauVar12 = (undefined1 (*) [16])(*pauVar12 + 4);
          uVar9 = uVar9 + 1;
        } while (uVar9 != uVar2);
      }
      uVar13 = uVar13 + 1;
    } while ((long)uVar13 < (long)local_60);
  }
  piVar8 = (int *)CONCAT44(local_b8._12_4_,local_b8._8_4_);
  if (piVar8 != (int *)0x0) {
    LOCK();
    *piVar8 = *piVar8 + -1;
    UNLOCK();
    if (*piVar8 == 0) {
      if ((Allocator *)local_b8._32_8_ == (Allocator *)0x0) {
        if ((void *)local_b8._0_8_ != (void *)0x0) {
          free((void *)local_b8._0_8_);
        }
      }
      else {
        (*(*(_func_int ***)local_b8._32_8_)[3])();
      }
    }
  }
  return;
}

Assistant:

static void im2col_sgemm_pack8to1_int8_sse(const Mat& bottom_im2col, Mat& top_blob, const Mat& kernel, const Option& opt)
{
#if !(__AVX512VNNI__ || __AVXVNNI__ || __AVX2__ || __XOP__)
#if NCNN_RUNTIME_CPU && NCNN_AVX512VNNI && __AVX512F__ && !__AVX512VNNI__
    if (ncnn::cpu_support_x86_avx512_vnni())
    {
        im2col_sgemm_pack8to1_int8_sse_avx512vnni(bottom_im2col, top_blob, kernel, opt);
        return;
    }
#endif

#if NCNN_RUNTIME_CPU && NCNN_AVXVNNI && __AVX2__ && !__AVXVNNI__
    if (ncnn::cpu_support_x86_avx_vnni())
    {
        im2col_sgemm_pack8to1_int8_sse_avxvnni(bottom_im2col, top_blob, kernel, opt);
        return;
    }
#endif

#if NCNN_RUNTIME_CPU && NCNN_AVX2 && __AVX__ && !__AVX2__
    if (ncnn::cpu_support_x86_avx2())
    {
        im2col_sgemm_pack8to1_int8_sse_avx2(bottom_im2col, top_blob, kernel, opt);
        return;
    }
#endif

#if NCNN_RUNTIME_CPU && NCNN_XOP && __SSE2__ && !__XOP__
    if (ncnn::cpu_support_x86_xop())
    {
        im2col_sgemm_pack8to1_int8_sse_xop(bottom_im2col, top_blob, kernel, opt);
        return;
    }
#endif
#endif

    // Mat bottom_im2col(size, maxk, inch, 8u, 8, opt.workspace_allocator);

    const int size = bottom_im2col.w;
    const int maxk = bottom_im2col.h;
    const int inch = bottom_im2col.c;

    const int outch = top_blob.c;

    // permute
    Mat tmp;
#if __AVX2__
    if (size >= 4)
        tmp.create(4 * maxk, inch, size / 4 + (size % 4) / 2 + size % 2, 8u, 8, opt.workspace_allocator);
    else if (size >= 2)
        tmp.create(2 * maxk, inch, size / 2 + size % 2, 8u, 8, opt.workspace_allocator);
    else
        tmp.create(maxk, inch, size, 8u, 8, opt.workspace_allocator);
#else
    if (size >= 2)
        tmp.create(2 * maxk, inch, size / 2 + size % 2, 8u, 8, opt.workspace_allocator);
    else
        tmp.create(maxk, inch, size, 8u, 8, opt.workspace_allocator);
#endif
    {
#if __AVX2__
        int remain_size_start = 0;
        int nn_size = size >> 2;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii = 0; ii < nn_size; ii++)
        {
            int i = remain_size_start + ii * 4;

            int64_t* tmpptr = tmp.channel(i / 4);

            for (int q = 0; q < inch; q++)
            {
                const int64_t* img0 = (const int64_t*)bottom_im2col.channel(q) + i;

                for (int k = 0; k < maxk; k++)
                {
                    __m256i _v = _mm256_loadu_si256((const __m256i*)img0);
                    _mm256_storeu_si256((__m256i*)tmpptr, _v);
                    tmpptr += 4;
                    img0 += size;
                }
            }
        }

        remain_size_start += nn_size << 2;
        nn_size = (size - remain_size_start) >> 1;
#else
        int remain_size_start = 0;
        int nn_size = (size - remain_size_start) >> 1;
#endif

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii = 0; ii < nn_size; ii++)
        {
            int i = remain_size_start + ii * 2;

#if __AVX2__
            int64_t* tmpptr = tmp.channel(i / 4 + (i % 4) / 2);
#else
            int64_t* tmpptr = tmp.channel(i / 2);
#endif

            for (int q = 0; q < inch; q++)
            {
                const int64_t* img0 = (const int64_t*)bottom_im2col.channel(q) + i;

                for (int k = 0; k < maxk; k++)
                {
                    __m128i _v = _mm_loadu_si128((const __m128i*)img0);
                    _mm_storeu_si128((__m128i*)tmpptr, _v);
                    tmpptr += 2;
                    img0 += size;
                }
            }
        }

        remain_size_start += nn_size << 1;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = remain_size_start; i < size; i++)
        {
#if __AVX2__
            int64_t* tmpptr = tmp.channel(i / 4 + (i % 4) / 2 + i % 2);
#else
            int64_t* tmpptr = tmp.channel(i / 2 + i % 2);
#endif

            for (int q = 0; q < inch; q++)
            {
                const int64_t* img0 = (const int64_t*)bottom_im2col.channel(q) + i;

                for (int k = 0; k < maxk; k++)
                {
                    tmpptr[0] = img0[0];
                    tmpptr += 1;
                    img0 += size;
                }
            }
        }
    }

    int nn_outch = 0;
    int remain_outch_start = 0;

    nn_outch = outch >> 2;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int pp = 0; pp < nn_outch; pp++)
    {
        int p = pp * 4;

        int* outptr0 = top_blob.channel(p);
        int* outptr1 = top_blob.channel(p + 1);
        int* outptr2 = top_blob.channel(p + 2);
        int* outptr3 = top_blob.channel(p + 3);

        int i = 0;
#if __AVX2__
        for (; i + 3 < size; i += 4)
        {
            const signed char* tmpptr = tmp.channel(i / 4);
            const signed char* kptr0 = kernel.channel(p / 4);

            int nn = inch * maxk; // inch always > 0

            __m256i _sum00_11 = _mm256_setzero_si256();
            __m256i _sum10_01 = _mm256_setzero_si256();
            __m256i _sum02_13 = _mm256_setzero_si256();
            __m256i _sum12_03 = _mm256_setzero_si256();

            __m256i _sum04_15 = _mm256_setzero_si256();
            __m256i _sum14_05 = _mm256_setzero_si256();
            __m256i _sum06_17 = _mm256_setzero_si256();
            __m256i _sum16_07 = _mm256_setzero_si256();

            int j = 0;
            for (; j < nn; j++)
            {
                __m128i _val01 = _mm_loadu_si128((const __m128i*)tmpptr);
                __m256i _val01_16 = _mm256_cvtepi8_epi16(_val01);

                __m128i _w01 = _mm_loadu_si128((const __m128i*)kptr0);
                __m128i _w23 = _mm_loadu_si128((const __m128i*)(kptr0 + 16));
                __m256i _w01_16 = _mm256_cvtepi8_epi16(_w01);
                __m256i _w23_16 = _mm256_cvtepi8_epi16(_w23);

                __m256i _val10_16 = _mm256_permute4x64_epi64(_val01_16, 78);

#if __AVXVNNI__ || __AVX512VNNI__
                _sum00_11 = _mm256_dpwssd_epi32(_sum00_11, _val01_16, _w01_16);
                _sum10_01 = _mm256_dpwssd_epi32(_sum10_01, _val10_16, _w01_16);
                _sum02_13 = _mm256_dpwssd_epi32(_sum02_13, _val01_16, _w23_16);
                _sum12_03 = _mm256_dpwssd_epi32(_sum12_03, _val10_16, _w23_16);
#else
                _sum00_11 = _mm256_add_epi32(_sum00_11, _mm256_madd_epi16(_val01_16, _w01_16));
                _sum10_01 = _mm256_add_epi32(_sum10_01, _mm256_madd_epi16(_val10_16, _w01_16));
                _sum02_13 = _mm256_add_epi32(_sum02_13, _mm256_madd_epi16(_val01_16, _w23_16));
                _sum12_03 = _mm256_add_epi32(_sum12_03, _mm256_madd_epi16(_val10_16, _w23_16));
#endif

                __m128i _val23 = _mm_loadu_si128((const __m128i*)(tmpptr + 16));
                __m256i _val23_16 = _mm256_cvtepi8_epi16(_val23);
                __m256i _val32_16 = _mm256_permute4x64_epi64(_val23_16, 78);

#if __AVXVNNI__ || __AVX512VNNI__
                _sum04_15 = _mm256_dpwssd_epi32(_sum04_15, _val23_16, _w01_16);
                _sum14_05 = _mm256_dpwssd_epi32(_sum14_05, _val32_16, _w01_16);
                _sum06_17 = _mm256_dpwssd_epi32(_sum06_17, _val23_16, _w23_16);
                _sum16_07 = _mm256_dpwssd_epi32(_sum16_07, _val32_16, _w23_16);
#else
                _sum04_15 = _mm256_add_epi32(_sum04_15, _mm256_madd_epi16(_val23_16, _w01_16));
                _sum14_05 = _mm256_add_epi32(_sum14_05, _mm256_madd_epi16(_val32_16, _w01_16));
                _sum06_17 = _mm256_add_epi32(_sum06_17, _mm256_madd_epi16(_val23_16, _w23_16));
                _sum16_07 = _mm256_add_epi32(_sum16_07, _mm256_madd_epi16(_val32_16, _w23_16));
#endif

                tmpptr += 32;
                kptr0 += 32;
            }

            // transpose 4x8
            {
                __m256i _tmp0, _tmp1, _tmp2, _tmp3;
                _tmp0 = _mm256_unpacklo_epi32(_sum00_11, _sum10_01);
                _tmp1 = _mm256_unpacklo_epi32(_sum02_13, _sum12_03);
                _tmp2 = _mm256_unpackhi_epi32(_sum00_11, _sum10_01);
                _tmp3 = _mm256_unpackhi_epi32(_sum02_13, _sum12_03);
                _sum00_11 = _mm256_unpacklo_epi64(_tmp0, _tmp1);
                _sum10_01 = _mm256_unpackhi_epi64(_tmp0, _tmp1);
                _sum02_13 = _mm256_unpacklo_epi64(_tmp2, _tmp3);
                _sum12_03 = _mm256_unpackhi_epi64(_tmp2, _tmp3);
            }
            {
                __m256i _tmp0, _tmp1, _tmp2, _tmp3;
                _tmp0 = _mm256_unpacklo_epi32(_sum04_15, _sum14_05);
                _tmp1 = _mm256_unpacklo_epi32(_sum06_17, _sum16_07);
                _tmp2 = _mm256_unpackhi_epi32(_sum04_15, _sum14_05);
                _tmp3 = _mm256_unpackhi_epi32(_sum06_17, _sum16_07);
                _sum04_15 = _mm256_unpacklo_epi64(_tmp0, _tmp1);
                _sum14_05 = _mm256_unpackhi_epi64(_tmp0, _tmp1);
                _sum06_17 = _mm256_unpacklo_epi64(_tmp2, _tmp3);
                _sum16_07 = _mm256_unpackhi_epi64(_tmp2, _tmp3);
            }

            _sum00_11 = _mm256_add_epi32(_sum00_11, _sum10_01);
            _sum02_13 = _mm256_add_epi32(_sum02_13, _sum12_03);
            _sum00_11 = _mm256_add_epi32(_sum00_11, _sum02_13);

            _sum04_15 = _mm256_add_epi32(_sum04_15, _sum14_05);
            _sum06_17 = _mm256_add_epi32(_sum06_17, _sum16_07);
            _sum04_15 = _mm256_add_epi32(_sum04_15, _sum06_17);

            __m256i _perm_mask = _mm256_set_epi32(6, 3, 4, 1, 7, 2, 5, 0);
            _sum00_11 = _mm256_permutevar8x32_epi32(_sum00_11, _perm_mask);
            _sum04_15 = _mm256_permutevar8x32_epi32(_sum04_15, _perm_mask);

            int sum[16];
            _mm256_storeu_si256((__m256i*)sum, _sum00_11);
            _mm256_storeu_si256((__m256i*)(sum + 8), _sum04_15);

            outptr0[0] = sum[0];
            outptr1[0] = sum[1];
            outptr2[0] = sum[2];
            outptr3[0] = sum[3];
            outptr0[1] = sum[4];
            outptr1[1] = sum[5];
            outptr2[1] = sum[6];
            outptr3[1] = sum[7];
            outptr0[2] = sum[8];
            outptr1[2] = sum[9];
            outptr2[2] = sum[10];
            outptr3[2] = sum[11];
            outptr0[3] = sum[12];
            outptr1[3] = sum[13];
            outptr2[3] = sum[14];
            outptr3[3] = sum[15];
            outptr0 += 4;
            outptr1 += 4;
            outptr2 += 4;
            outptr3 += 4;
        }
#endif
        for (; i + 1 < size; i += 2)
        {
#if __AVX2__
            const signed char* tmpptr = tmp.channel(i / 4 + (i % 4) / 2);
#else
            const signed char* tmpptr = tmp.channel(i / 2);
#endif
            const signed char* kptr0 = kernel.channel(p / 4);

            int nn = inch * maxk; // inch always > 0

#if __AVX2__
            __m256i _sum00_11 = _mm256_setzero_si256();
            __m256i _sum10_01 = _mm256_setzero_si256();
            __m256i _sum02_13 = _mm256_setzero_si256();
            __m256i _sum12_03 = _mm256_setzero_si256();
#else
            __m128i _sum00 = _mm_setzero_si128();
            __m128i _sum01 = _mm_setzero_si128();
            __m128i _sum02 = _mm_setzero_si128();
            __m128i _sum03 = _mm_setzero_si128();
            __m128i _sum10 = _mm_setzero_si128();
            __m128i _sum11 = _mm_setzero_si128();
            __m128i _sum12 = _mm_setzero_si128();
            __m128i _sum13 = _mm_setzero_si128();
#endif

            int j = 0;
            for (; j < nn; j++)
            {
#if __AVX2__
                __m128i _val01 = _mm_loadu_si128((const __m128i*)tmpptr);
                __m256i _val01_16 = _mm256_cvtepi8_epi16(_val01);

                __m128i _w01 = _mm_loadu_si128((const __m128i*)kptr0);
                __m128i _w23 = _mm_loadu_si128((const __m128i*)(kptr0 + 16));
                __m256i _w01_16 = _mm256_cvtepi8_epi16(_w01);
                __m256i _w23_16 = _mm256_cvtepi8_epi16(_w23);

                __m256i _val10_16 = _mm256_permute4x64_epi64(_val01_16, 78);

#if __AVXVNNI__ || __AVX512VNNI__
                _sum00_11 = _mm256_dpwssd_epi32(_sum00_11, _val01_16, _w01_16);
                _sum10_01 = _mm256_dpwssd_epi32(_sum10_01, _val10_16, _w01_16);
                _sum02_13 = _mm256_dpwssd_epi32(_sum02_13, _val01_16, _w23_16);
                _sum12_03 = _mm256_dpwssd_epi32(_sum12_03, _val10_16, _w23_16);
#else
                _sum00_11 = _mm256_add_epi32(_sum00_11, _mm256_madd_epi16(_val01_16, _w01_16));
                _sum10_01 = _mm256_add_epi32(_sum10_01, _mm256_madd_epi16(_val10_16, _w01_16));
                _sum02_13 = _mm256_add_epi32(_sum02_13, _mm256_madd_epi16(_val01_16, _w23_16));
                _sum12_03 = _mm256_add_epi32(_sum12_03, _mm256_madd_epi16(_val10_16, _w23_16));
#endif
#else
                __m128i _val01 = _mm_loadu_si128((const __m128i*)tmpptr);
                __m128i _extval01 = _mm_cmpgt_epi8(_mm_setzero_si128(), _val01);
                __m128i _val0 = _mm_unpacklo_epi8(_val01, _extval01);
                __m128i _val1 = _mm_unpackhi_epi8(_val01, _extval01);

                __m128i _w01 = _mm_loadu_si128((const __m128i*)kptr0);
                __m128i _w23 = _mm_loadu_si128((const __m128i*)(kptr0 + 16));
                __m128i _extw01 = _mm_cmpgt_epi8(_mm_setzero_si128(), _w01);
                __m128i _extw23 = _mm_cmpgt_epi8(_mm_setzero_si128(), _w23);
                __m128i _w0 = _mm_unpacklo_epi8(_w01, _extw01);
                __m128i _w1 = _mm_unpackhi_epi8(_w01, _extw01);
                __m128i _w2 = _mm_unpacklo_epi8(_w23, _extw23);
                __m128i _w3 = _mm_unpackhi_epi8(_w23, _extw23);

#if __XOP__
                _sum00 = _mm_maddd_epi16(_val0, _w0, _sum00);
                _sum01 = _mm_maddd_epi16(_val0, _w1, _sum01);
                _sum02 = _mm_maddd_epi16(_val0, _w2, _sum02);
                _sum03 = _mm_maddd_epi16(_val0, _w3, _sum03);
                _sum10 = _mm_maddd_epi16(_val1, _w0, _sum10);
                _sum11 = _mm_maddd_epi16(_val1, _w1, _sum11);
                _sum12 = _mm_maddd_epi16(_val1, _w2, _sum12);
                _sum13 = _mm_maddd_epi16(_val1, _w3, _sum13);
#else
                _sum00 = _mm_add_epi32(_mm_madd_epi16(_val0, _w0), _sum00);
                _sum01 = _mm_add_epi32(_mm_madd_epi16(_val0, _w1), _sum01);
                _sum02 = _mm_add_epi32(_mm_madd_epi16(_val0, _w2), _sum02);
                _sum03 = _mm_add_epi32(_mm_madd_epi16(_val0, _w3), _sum03);
                _sum10 = _mm_add_epi32(_mm_madd_epi16(_val1, _w0), _sum10);
                _sum11 = _mm_add_epi32(_mm_madd_epi16(_val1, _w1), _sum11);
                _sum12 = _mm_add_epi32(_mm_madd_epi16(_val1, _w2), _sum12);
                _sum13 = _mm_add_epi32(_mm_madd_epi16(_val1, _w3), _sum13);
#endif
#endif

                tmpptr += 16;
                kptr0 += 32;
            }

#if __AVX2__
            // transpose 4x8
            {
                __m256i _tmp0, _tmp1, _tmp2, _tmp3;
                _tmp0 = _mm256_unpacklo_epi32(_sum00_11, _sum10_01);
                _tmp1 = _mm256_unpacklo_epi32(_sum02_13, _sum12_03);
                _tmp2 = _mm256_unpackhi_epi32(_sum00_11, _sum10_01);
                _tmp3 = _mm256_unpackhi_epi32(_sum02_13, _sum12_03);
                _sum00_11 = _mm256_unpacklo_epi64(_tmp0, _tmp1);
                _sum10_01 = _mm256_unpackhi_epi64(_tmp0, _tmp1);
                _sum02_13 = _mm256_unpacklo_epi64(_tmp2, _tmp3);
                _sum12_03 = _mm256_unpackhi_epi64(_tmp2, _tmp3);
            }

            _sum00_11 = _mm256_add_epi32(_sum00_11, _sum10_01);
            _sum02_13 = _mm256_add_epi32(_sum02_13, _sum12_03);
            _sum00_11 = _mm256_add_epi32(_sum00_11, _sum02_13);

            __m256i _perm_mask = _mm256_set_epi32(6, 3, 4, 1, 7, 2, 5, 0);
            _sum00_11 = _mm256_permutevar8x32_epi32(_sum00_11, _perm_mask);

            int sum[8];
            _mm256_storeu_si256((__m256i*)sum, _sum00_11);
#else
            // transpose 4x4
            {
                __m128i _tmp0, _tmp1, _tmp2, _tmp3;
                _tmp0 = _mm_unpacklo_epi32(_sum00, _sum01);
                _tmp1 = _mm_unpacklo_epi32(_sum02, _sum03);
                _tmp2 = _mm_unpackhi_epi32(_sum00, _sum01);
                _tmp3 = _mm_unpackhi_epi32(_sum02, _sum03);
                _sum00 = _mm_unpacklo_epi64(_tmp0, _tmp1);
                _sum01 = _mm_unpackhi_epi64(_tmp0, _tmp1);
                _sum02 = _mm_unpacklo_epi64(_tmp2, _tmp3);
                _sum03 = _mm_unpackhi_epi64(_tmp2, _tmp3);
            }
            {
                __m128i _tmp0, _tmp1, _tmp2, _tmp3;
                _tmp0 = _mm_unpacklo_epi32(_sum10, _sum11);
                _tmp1 = _mm_unpacklo_epi32(_sum12, _sum13);
                _tmp2 = _mm_unpackhi_epi32(_sum10, _sum11);
                _tmp3 = _mm_unpackhi_epi32(_sum12, _sum13);
                _sum10 = _mm_unpacklo_epi64(_tmp0, _tmp1);
                _sum11 = _mm_unpackhi_epi64(_tmp0, _tmp1);
                _sum12 = _mm_unpacklo_epi64(_tmp2, _tmp3);
                _sum13 = _mm_unpackhi_epi64(_tmp2, _tmp3);
            }

            _sum00 = _mm_add_epi32(_sum00, _sum01);
            _sum02 = _mm_add_epi32(_sum02, _sum03);
            _sum10 = _mm_add_epi32(_sum10, _sum11);
            _sum12 = _mm_add_epi32(_sum12, _sum13);

            _sum00 = _mm_add_epi32(_sum00, _sum02);
            _sum10 = _mm_add_epi32(_sum10, _sum12);

            int sum[8];
            _mm_storeu_si128((__m128i*)sum, _sum00);
            _mm_storeu_si128((__m128i*)(sum + 4), _sum10);
#endif

            outptr0[0] = sum[0];
            outptr1[0] = sum[1];
            outptr2[0] = sum[2];
            outptr3[0] = sum[3];
            outptr0[1] = sum[4];
            outptr1[1] = sum[5];
            outptr2[1] = sum[6];
            outptr3[1] = sum[7];
            outptr0 += 2;
            outptr1 += 2;
            outptr2 += 2;
            outptr3 += 2;
        }
        for (; i < size; i++)
        {
#if __AVX2__
            const signed char* tmpptr = tmp.channel(i / 4 + (i % 4) / 2 + i % 2);
#else
            const signed char* tmpptr = tmp.channel(i / 2 + i % 2);
#endif
            const signed char* kptr0 = kernel.channel(p / 4);

            int nn = inch * maxk; // inch always > 0

#if __AVX2__
            __m256i _sum0_1 = _mm256_setzero_si256();
            __m256i _sum2_3 = _mm256_setzero_si256();
#else
            __m128i _sum0 = _mm_setzero_si128();
            __m128i _sum1 = _mm_setzero_si128();
            __m128i _sum2 = _mm_setzero_si128();
            __m128i _sum3 = _mm_setzero_si128();
#endif

            int j = 0;
            for (; j < nn; j++)
            {
#if __AVX2__
                __m128i _val = _mm_loadl_epi64((const __m128i*)tmpptr);
                _val = _mm_cvtepi8_epi16(_val);

                __m128i _w01 = _mm_loadu_si128((const __m128i*)kptr0);
                __m128i _w23 = _mm_loadu_si128((const __m128i*)(kptr0 + 16));
                __m256i _w01_16 = _mm256_cvtepi8_epi16(_w01);
                __m256i _w23_16 = _mm256_cvtepi8_epi16(_w23);

                __m256i _valval = _mm256_inserti128_si256(_mm256_castsi128_si256(_val), _val, 1);

#if __AVXVNNI__ || __AVX512VNNI__
                _sum0_1 = _mm256_dpwssd_epi32(_sum0_1, _valval, _w01_16);
                _sum2_3 = _mm256_dpwssd_epi32(_sum2_3, _valval, _w23_16);
#else
                _sum0_1 = _mm256_add_epi32(_sum0_1, _mm256_madd_epi16(_valval, _w01_16));
                _sum2_3 = _mm256_add_epi32(_sum2_3, _mm256_madd_epi16(_valval, _w23_16));
#endif
#else
                __m128i _val = _mm_loadl_epi64((const __m128i*)tmpptr);
#if __SSE4_1__
                _val = _mm_cvtepi8_epi16(_val);
#else
                _val = _mm_unpacklo_epi8(_val, _mm_cmpgt_epi8(_mm_setzero_si128(), _val));
#endif

                __m128i _w01 = _mm_loadu_si128((const __m128i*)kptr0);
                __m128i _w23 = _mm_loadu_si128((const __m128i*)(kptr0 + 16));
                __m128i _extw01 = _mm_cmpgt_epi8(_mm_setzero_si128(), _w01);
                __m128i _extw23 = _mm_cmpgt_epi8(_mm_setzero_si128(), _w23);
                __m128i _w0 = _mm_unpacklo_epi8(_w01, _extw01);
                __m128i _w1 = _mm_unpackhi_epi8(_w01, _extw01);
                __m128i _w2 = _mm_unpacklo_epi8(_w23, _extw23);
                __m128i _w3 = _mm_unpackhi_epi8(_w23, _extw23);

#if __XOP__
                _sum0 = _mm_maddd_epi16(_val, _w0, _sum0);
                _sum1 = _mm_maddd_epi16(_val, _w1, _sum1);
                _sum2 = _mm_maddd_epi16(_val, _w2, _sum2);
                _sum3 = _mm_maddd_epi16(_val, _w3, _sum3);
#else
                _sum0 = _mm_add_epi32(_mm_madd_epi16(_val, _w0), _sum0);
                _sum1 = _mm_add_epi32(_mm_madd_epi16(_val, _w1), _sum1);
                _sum2 = _mm_add_epi32(_mm_madd_epi16(_val, _w2), _sum2);
                _sum3 = _mm_add_epi32(_mm_madd_epi16(_val, _w3), _sum3);
#endif
#endif

                tmpptr += 8;
                kptr0 += 32;
            }

#if __AVX2__
            __m128i _sum0 = _mm256_extracti128_si256(_sum0_1, 0);
            __m128i _sum1 = _mm256_extracti128_si256(_sum0_1, 1);
            __m128i _sum2 = _mm256_extracti128_si256(_sum2_3, 0);
            __m128i _sum3 = _mm256_extracti128_si256(_sum2_3, 1);
#endif

            // transpose 4x4
            {
                __m128i _tmp0, _tmp1, _tmp2, _tmp3;
                _tmp0 = _mm_unpacklo_epi32(_sum0, _sum1);
                _tmp1 = _mm_unpacklo_epi32(_sum2, _sum3);
                _tmp2 = _mm_unpackhi_epi32(_sum0, _sum1);
                _tmp3 = _mm_unpackhi_epi32(_sum2, _sum3);
                _sum0 = _mm_unpacklo_epi64(_tmp0, _tmp1);
                _sum1 = _mm_unpackhi_epi64(_tmp0, _tmp1);
                _sum2 = _mm_unpacklo_epi64(_tmp2, _tmp3);
                _sum3 = _mm_unpackhi_epi64(_tmp2, _tmp3);
            }

            _sum0 = _mm_add_epi32(_sum0, _sum1);
            _sum2 = _mm_add_epi32(_sum2, _sum3);

            _sum0 = _mm_add_epi32(_sum0, _sum2);

            int sum[4];
            _mm_storeu_si128((__m128i*)sum, _sum0);

            outptr0[0] = sum[0];
            outptr1[0] = sum[1];
            outptr2[0] = sum[2];
            outptr3[0] = sum[3];
            outptr0 += 1;
            outptr1 += 1;
            outptr2 += 1;
            outptr3 += 1;
        }
    }

    remain_outch_start += nn_outch << 2;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = remain_outch_start; p < outch; p++)
    {
        int* outptr0 = top_blob.channel(p);

        int i = 0;
#if __AVX2__
        for (; i + 3 < size; i += 4)
        {
            const signed char* tmpptr = tmp.channel(i / 4);
            const signed char* kptr0 = kernel.channel(p / 4 + p % 4);

            int nn = inch * maxk; // inch always > 0

            __m256i _sum01 = _mm256_setzero_si256();
            __m256i _sum23 = _mm256_setzero_si256();

            int j = 0;
            for (; j < nn; j++)
            {
                __m128i _val01 = _mm_loadu_si128((const __m128i*)tmpptr);
                __m128i _val23 = _mm_loadu_si128((const __m128i*)(tmpptr + 16));
                __m256i _val01_16 = _mm256_cvtepi8_epi16(_val01);
                __m256i _val23_16 = _mm256_cvtepi8_epi16(_val23);

                __m128i _w01 = _mm_loadl_epi64((const __m128i*)kptr0);
                __m256i _w01_16 = _mm256_cvtepi8_epi16(_w01);
                _w01_16 = _mm256_permute4x64_epi64(_w01_16, _MM_SHUFFLE(1, 0, 1, 0));

#if __AVXVNNI__ || __AVX512VNNI__
                _sum01 = _mm256_dpwssd_epi32(_sum01, _val01_16, _w01_16);
                _sum23 = _mm256_dpwssd_epi32(_sum23, _val23_16, _w01_16);
#else
                _sum01 = _mm256_add_epi32(_sum01, _mm256_madd_epi16(_val01_16, _w01_16));
                _sum23 = _mm256_add_epi32(_sum23, _mm256_madd_epi16(_val23_16, _w01_16));
#endif

                tmpptr += 32;
                kptr0 += 8;
            }

            __m128i _sum0 = _mm256_extracti128_si256(_sum01, 0);
            __m128i _sum1 = _mm256_extracti128_si256(_sum01, 1);
            __m128i _sum2 = _mm256_extracti128_si256(_sum23, 0);
            __m128i _sum3 = _mm256_extracti128_si256(_sum23, 1);

            outptr0[0] = _mm_reduce_add_epi32(_sum0);
            outptr0[1] = _mm_reduce_add_epi32(_sum1);
            outptr0[2] = _mm_reduce_add_epi32(_sum2);
            outptr0[3] = _mm_reduce_add_epi32(_sum3);
            outptr0 += 4;
        }
#endif
        for (; i + 1 < size; i += 2)
        {
#if __AVX2__
            const signed char* tmpptr = tmp.channel(i / 4 + (i % 4) / 2);
#else
            const signed char* tmpptr = tmp.channel(i / 2);
#endif
            const signed char* kptr0 = kernel.channel(p / 4 + p % 4);

            int nn = inch * maxk; // inch always > 0

#if __AVX2__
            __m256i _sum01 = _mm256_setzero_si256();
#else
            __m128i _sum0 = _mm_setzero_si128();
            __m128i _sum1 = _mm_setzero_si128();
#endif

            int j = 0;
            for (; j < nn; j++)
            {
#if __AVX2__
                __m128i _val01 = _mm_loadu_si128((const __m128i*)tmpptr);
                __m256i _val01_16 = _mm256_cvtepi8_epi16(_val01);

                __m128i _w01 = _mm_loadl_epi64((const __m128i*)kptr0);
                __m256i _w01_16 = _mm256_cvtepi8_epi16(_w01);
                _w01_16 = _mm256_permute4x64_epi64(_w01_16, _MM_SHUFFLE(1, 0, 1, 0));

#if __AVXVNNI__ || __AVX512VNNI__
                _sum01 = _mm256_dpwssd_epi32(_sum01, _val01_16, _w01_16);
#else
                _sum01 = _mm256_add_epi32(_sum01, _mm256_madd_epi16(_val01_16, _w01_16));
#endif
#else
                __m128i _val01 = _mm_loadu_si128((const __m128i*)tmpptr);
                __m128i _extval01 = _mm_cmpgt_epi8(_mm_setzero_si128(), _val01);
                __m128i _val0 = _mm_unpacklo_epi8(_val01, _extval01);
                __m128i _val1 = _mm_unpackhi_epi8(_val01, _extval01);

                __m128i _w01 = _mm_loadl_epi64((const __m128i*)kptr0);
#if __SSE4_1__
                __m128i _w0 = _mm_cvtepi8_epi16(_w01);
#else
                __m128i _extw01 = _mm_cmpgt_epi8(_mm_setzero_si128(), _w01);
                __m128i _w0 = _mm_unpacklo_epi8(_w01, _extw01);
#endif

#if __XOP__
                _sum0 = _mm_maddd_epi16(_val0, _w0, _sum0);
                _sum1 = _mm_maddd_epi16(_val1, _w0, _sum1);
#else
                _sum0 = _mm_add_epi32(_mm_madd_epi16(_val0, _w0), _sum0);
                _sum1 = _mm_add_epi32(_mm_madd_epi16(_val1, _w0), _sum1);
#endif
#endif

                tmpptr += 16;
                kptr0 += 8;
            }

#if __AVX2__
            __m128i _sum0 = _mm256_extracti128_si256(_sum01, 0);
            __m128i _sum1 = _mm256_extracti128_si256(_sum01, 1);
#endif

            outptr0[0] = _mm_reduce_add_epi32(_sum0);
            outptr0[1] = _mm_reduce_add_epi32(_sum1);
            outptr0 += 2;
        }
        for (; i < size; i++)
        {
#if __AVX2__
            const signed char* tmpptr = tmp.channel(i / 4 + (i % 4) / 2 + i % 2);
#else
            const signed char* tmpptr = tmp.channel(i / 2 + i % 2);
#endif
            const signed char* kptr0 = kernel.channel(p / 4 + p % 4);

            int nn = inch * maxk; // inch always > 0

            __m128i _sum0 = _mm_setzero_si128();

            int j = 0;
            for (; j < nn; j++)
            {
                __m128i _val01 = _mm_loadl_epi64((const __m128i*)tmpptr);
#if __SSE4_1__
                __m128i _val0 = _mm_cvtepi8_epi16(_val01);
#else
                __m128i _extval01 = _mm_cmpgt_epi8(_mm_setzero_si128(), _val01);
                __m128i _val0 = _mm_unpacklo_epi8(_val01, _extval01);
#endif

                __m128i _w01 = _mm_loadl_epi64((const __m128i*)kptr0);
#if __SSE4_1__
                __m128i _w0 = _mm_cvtepi8_epi16(_w01);
#else
                __m128i _extw01 = _mm_cmpgt_epi8(_mm_setzero_si128(), _w01);
                __m128i _w0 = _mm_unpacklo_epi8(_w01, _extw01);
#endif

#if __XOP__
                _sum0 = _mm_maddd_epi16(_val0, _w0, _sum0);
#else
                _sum0 = _mm_add_epi32(_mm_madd_epi16(_val0, _w0), _sum0);
#endif

                tmpptr += 8;
                kptr0 += 8;
            }

            outptr0[0] = _mm_reduce_add_epi32(_sum0);
            outptr0 += 1;
        }
    }
}